

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O3

void draw_sprite(Sprite *spr)

{
  ALLEGRO_BITMAP *pAVar1;
  
  pAVar1 = images[spr->image];
  al_get_bitmap_width(pAVar1);
  al_get_bitmap_height(pAVar1);
  al_map_rgba_f(spr->r,spr->g,spr->b,spr->opacity);
  al_draw_tinted_scaled_rotated_bitmap(pAVar1,0);
  return;
}

Assistant:

static void draw_sprite(const Sprite *spr)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_COLOR tint;
   float cx, cy;

   bmp = images[spr->image];
   cx = spr->align_x * al_get_bitmap_width(bmp);
   cy = spr->align_y * al_get_bitmap_height(bmp);
   tint = al_map_rgba_f(spr->r, spr->g, spr->b, spr->opacity);

   al_draw_tinted_scaled_rotated_bitmap(bmp, tint, cx, cy,
      spr->x, spr->y, spr->scale_x, spr->scale_y, spr->angle, 0);
}